

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O3

void __thiscall Threadpool<Workerthread>::~Threadpool(Threadpool<Workerthread> *this)

{
  pointer ppWVar1;
  int in_ESI;
  
  if (((this->stop)._M_base._M_i & 1U) == 0) {
    exit(this,in_ESI);
  }
  std::condition_variable::~condition_variable(&this->cv_finished);
  std::condition_variable::~condition_variable(&this->cv_task);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque(&this->tasks)
  ;
  ppWVar1 = (this->workers).super__Vector_base<Workerthread_*,_std::allocator<Workerthread_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppWVar1 != (pointer)0x0) {
    operator_delete(ppWVar1,(long)(this->workers).
                                  super__Vector_base<Workerthread_*,_std::allocator<Workerthread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppWVar1
                   );
    return;
  }
  return;
}

Assistant:

~Threadpool() { if (!stop) exit(); }